

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

void __thiscall
slang::ast::Compilation::noteExternDefinition(Compilation *this,Scope *scope,SyntaxNode *syntax)

{
  size_t *psVar1;
  long lVar2;
  group_type_pointer pgVar3;
  RootSymbol *pRVar4;
  value_type_pointer ppVar5;
  ulong uVar6;
  int iVar7;
  undefined1 auVar8 [16];
  char *pcVar9;
  Compilation *pCVar10;
  bool bVar11;
  UdpPortListSyntax *prevNode;
  SourceLocation SVar12;
  Diagnostic *this_00;
  SyntaxNode *pSVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>
  *unaff_R13;
  pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>
  *ppVar18;
  undefined1 auVar19 [16];
  uchar uVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  string_view arg;
  string_view name;
  DiagCode in_stack_ffffffffffffff08;
  try_emplace_args_t local_e9;
  char *local_e8;
  Scope *local_e0;
  ulong local_d8;
  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::SyntaxNode_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,slang::syntax::SyntaxNode_const*>>>
  *local_d0;
  Compilation *local_c8;
  SyntaxNode *local_c0;
  undefined8 local_b8;
  uchar uStack_b0;
  uchar uStack_af;
  uchar uStack_ae;
  uchar uStack_ad;
  uchar uStack_ac;
  uchar uStack_ab;
  uchar uStack_aa;
  uchar uStack_a9;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  long local_80;
  group_type_pointer local_78;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*> local_70;
  size_t seed;
  SyntaxNode *pSStack_50;
  pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>
  *local_48;
  Token nameToken;
  
  if (syntax->kind == ExternModuleDecl) {
    pSVar13 = (SyntaxNode *)&syntax[6].parent[2].parent;
  }
  else {
    pSVar13 = syntax + 7;
  }
  nameToken._0_8_ = *(undefined8 *)pSVar13;
  nameToken.info = (Info *)pSVar13->parent;
  local_70.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl
       = parsing::Token::valueText(&nameToken);
  local_e8 = local_70.
             super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
             .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
             _M_head_impl._M_str;
  prevNode = (UdpPortListSyntax *)
             local_70.
             super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
             .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
             _M_head_impl._M_len;
  if (prevNode != (UdpPortListSyntax *)0x0) {
    pRVar4 = (this->root)._M_t.
             super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
             ._M_t.
             super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
             .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
    local_70.
    super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
    .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
    super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
         (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)&pRVar4->super_Scope;
    if (pRVar4 == (RootSymbol *)0x0) {
      local_70.
      super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
      .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
      super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
           (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)(Scope *)0x0;
    }
    if (scope->thisSym->kind != CompilationUnit) {
      local_70.
      super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
      .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
      super__Head_base<1UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
           (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)
           (_Head_base<1UL,_const_slang::ast::Scope_*,_false>)scope;
    }
    local_d0 = (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::SyntaxNode_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,slang::syntax::SyntaxNode_const*>>>
                *)&this->externDefMap;
    seed = 0;
    local_c0 = syntax;
    slang::detail::hashing::
    HashValueImpl<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_1UL>
    ::apply(&seed,&local_70);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = seed;
    local_d8 = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar8,8) ^
               SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar8,0);
    uVar16 = local_d8 >>
             ((byte)(this->externDefMap).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
                    .arrays.groups_size_index & 0x3f);
    lVar2 = (local_d8 & 0xff) * 4;
    uVar20 = (&UNK_0047fb5c)[lVar2];
    uVar21 = (&UNK_0047fb5d)[lVar2];
    uVar22 = (&UNK_0047fb5e)[lVar2];
    uVar23 = (&UNK_0047fb5f)[lVar2];
    uVar15 = (ulong)((uint)local_d8 & 7);
    uVar17 = 0;
    uVar24 = uVar20;
    uVar25 = uVar21;
    uVar26 = uVar22;
    uVar27 = uVar23;
    uVar28 = uVar20;
    uVar29 = uVar21;
    uVar30 = uVar22;
    uVar31 = uVar23;
    uVar32 = uVar20;
    uVar33 = uVar21;
    uVar34 = uVar22;
    uVar35 = uVar23;
    local_c8 = this;
    local_88 = uVar16;
    do {
      local_78 = (local_c8->externDefMap).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
                 .arrays.groups_;
      local_80 = uVar16 * 0x10;
      pgVar3 = local_78 + uVar16;
      auVar19[0] = -(pgVar3->m[0].n == uVar20);
      auVar19[1] = -(pgVar3->m[1].n == uVar21);
      auVar19[2] = -(pgVar3->m[2].n == uVar22);
      auVar19[3] = -(pgVar3->m[3].n == uVar23);
      auVar19[4] = -(pgVar3->m[4].n == uVar24);
      auVar19[5] = -(pgVar3->m[5].n == uVar25);
      auVar19[6] = -(pgVar3->m[6].n == uVar26);
      auVar19[7] = -(pgVar3->m[7].n == uVar27);
      auVar19[8] = -(pgVar3->m[8].n == uVar28);
      auVar19[9] = -(pgVar3->m[9].n == uVar29);
      auVar19[10] = -(pgVar3->m[10].n == uVar30);
      auVar19[0xb] = -(pgVar3->m[0xb].n == uVar31);
      auVar19[0xc] = -(pgVar3->m[0xc].n == uVar32);
      auVar19[0xd] = -(pgVar3->m[0xd].n == uVar33);
      auVar19[0xe] = -(pgVar3->m[0xe].n == uVar34);
      auVar19[0xf] = -(pgVar3->m[0xf].n == uVar35);
      uVar14 = (uint)(ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe);
      local_98 = uVar17;
      local_90 = uVar16;
      if (uVar14 != 0) {
        ppVar5 = (local_c8->externDefMap).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
                 .arrays.elements_;
        local_b8 = (pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>
                    *)CONCAT17(uVar27,CONCAT16(uVar26,CONCAT15(uVar25,CONCAT14(uVar24,CONCAT13(
                                                  uVar23,CONCAT12(uVar22,CONCAT11(uVar21,uVar20)))))
                                              ));
        ppVar18 = unaff_R13;
        local_e0 = scope;
        uStack_b0 = uVar28;
        uStack_af = uVar29;
        uStack_ae = uVar30;
        uStack_ad = uVar31;
        uStack_ac = uVar32;
        uStack_ab = uVar33;
        uStack_aa = uVar34;
        uStack_a9 = uVar35;
        local_a0 = uVar15;
        do {
          iVar7 = 0;
          if (uVar14 != 0) {
            for (; (uVar14 >> iVar7 & 1) == 0; iVar7 = iVar7 + 1) {
            }
          }
          unaff_R13 = (pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>
                       *)((long)&ppVar5[uVar16 * 0xf].first.
                                 super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                 .super__Tuple_impl<1UL,_const_slang::ast::Scope_*>.
                                 super__Head_base<1UL,_const_slang::ast::Scope_*,_false>.
                                 _M_head_impl + (ulong)(uint)(iVar7 << 5));
          bVar11 = std::
                   __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_2UL>
                   ::__eq(&local_70,
                          (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                           *)unaff_R13);
          if (!bVar11) {
            uVar14 = uVar14 - 1 & uVar14;
            unaff_R13 = ppVar18;
          }
          scope = local_e0;
          if (bVar11) goto LAB_00298144;
          ppVar18 = unaff_R13;
        } while (uVar14 != 0);
        uVar15 = local_a0;
        uVar20 = (uchar)local_b8;
        uVar21 = local_b8._1_1_;
        uVar22 = local_b8._2_1_;
        uVar23 = local_b8._3_1_;
        uVar24 = local_b8._4_1_;
        uVar25 = local_b8._5_1_;
        uVar26 = local_b8._6_1_;
        uVar27 = local_b8._7_1_;
        uVar28 = uStack_b0;
        uVar29 = uStack_af;
        uVar30 = uStack_ae;
        uVar31 = uStack_ad;
        uVar32 = uStack_ac;
        uVar33 = uStack_ab;
        uVar34 = uStack_aa;
        uVar35 = uStack_a9;
        if (bVar11) goto LAB_00298144;
      }
      if ((local_78->m[local_80 + 0xf].n &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[uVar15]) == 0) {
        unaff_R13 = (pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>
                     *)0x0;
        goto LAB_00298144;
      }
      uVar6 = (local_c8->externDefMap).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
              .arrays.groups_size_mask;
      uVar17 = local_98 + 1;
      uVar16 = local_90 + local_98 + 1 & uVar6;
    } while (uVar17 <= uVar6);
    unaff_R13 = (pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>
                 *)0x0;
LAB_00298144:
    pCVar10 = local_c8;
    ppVar18 = unaff_R13;
    if (unaff_R13 ==
        (pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>
         *)0x0) {
      local_b8 = unaff_R13;
      if ((local_c8->externDefMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
          .size_ctrl.size <
          (local_c8->externDefMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
          .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::SyntaxNode_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,slang::syntax::SyntaxNode_const*>>>
        ::
        nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::SyntaxNode_const*>
                  ((locator *)&seed,local_d0,(arrays_type *)local_d0,local_88,local_d8,&local_e9,
                   &local_70,&local_c0);
        psVar1 = &(pCVar10->externDefMap).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>,_slang::hash<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>_>_>
                  .size_ctrl.size;
        *psVar1 = *psVar1 + 1;
        ppVar18 = local_b8;
        unaff_R13 = local_48;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::SyntaxNode_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,slang::syntax::SyntaxNode_const*>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,slang::syntax::SyntaxNode_const*>
                  ((locator *)&seed,local_d0,local_d8,&local_e9,&local_70,&local_c0);
        ppVar18 = local_b8;
        unaff_R13 = local_48;
      }
    }
    pcVar9 = local_e8;
    if (ppVar18 !=
        (pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_const_slang::syntax::SyntaxNode_*>
         *)0x0) {
      pSVar13 = unaff_R13->second;
      if (syntax->kind == pSVar13->kind) {
        if (syntax->kind == ExternModuleDecl) {
          checkExternModMatch(scope,(ModuleHeaderSyntax *)syntax[6].parent,
                              (ModuleHeaderSyntax *)pSVar13[6].parent,(DiagCode)0xc000d);
        }
        else {
          name._M_str = (char *)0xc000d;
          name._M_len = (size_t)local_e8;
          checkExternUdpMatch((ast *)scope,(Scope *)syntax[7].previewNode,
                              (UdpPortListSyntax *)pSVar13[7].previewNode,prevNode,name,
                              in_stack_ffffffffffffff08);
        }
      }
      else {
        SVar12 = parsing::Token::location(&nameToken);
        this_00 = Scope::addDiag(scope,(DiagCode)0x2a000a,SVar12);
        arg._M_str = pcVar9;
        arg._M_len = (size_t)prevNode;
        Diagnostic::operator<<(this_00,arg);
        pSVar13 = unaff_R13->second;
        if (pSVar13->kind == ExternModuleDecl) {
          pSVar13 = (SyntaxNode *)&pSVar13[6].parent[2].parent;
        }
        else {
          pSVar13 = pSVar13 + 7;
        }
        seed = *(size_t *)pSVar13;
        pSStack_50 = pSVar13->parent;
        SVar12 = parsing::Token::location((Token *)&seed);
        Diagnostic::addNote(this_00,(DiagCode)0xa0001,SVar12);
      }
    }
  }
  return;
}

Assistant:

void Compilation::noteExternDefinition(const Scope& scope, const SyntaxNode& syntax) {
    SLANG_ASSERT(!isFrozen());

    auto nameToken = getExternNameToken(syntax);
    auto name = nameToken.valueText();
    if (name.empty())
        return;

    auto targetScope = scope.asSymbol().kind == SymbolKind::CompilationUnit ? root.get() : &scope;
    auto [it, inserted] = externDefMap.emplace(std::tuple(name, targetScope), &syntax);
    if (!inserted) {
        if (syntax.kind != it->second->kind) {
            auto& diag = scope.addDiag(diag::Redefinition, nameToken.location());
            diag << name;
            diag.addNote(diag::NotePreviousDefinition, getExternNameToken(*it->second).location());
        }
        else if (syntax.kind == SyntaxKind::ExternModuleDecl) {
            checkExternModMatch(scope, *syntax.as<ExternModuleDeclSyntax>().header,
                                *it->second->as<ExternModuleDeclSyntax>().header,
                                diag::ExternDeclMismatchPrev);
        }
        else {
            checkExternUdpMatch(scope, *syntax.as<ExternUdpDeclSyntax>().portList,
                                *it->second->as<ExternUdpDeclSyntax>().portList, name,
                                diag::ExternDeclMismatchPrev);
        }
    }
}